

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_9::DiskHandle::tryOpenSubdir(DiskHandle *this,PathPtr path)

{
  Disposer *extraout_RAX;
  ReadableDirectory *extraout_RDX;
  Own<kj::ReadableDirectory,_std::nullptr_t> OVar1;
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> MVar2;
  DiskHandle local_30;
  OwnFd local_2c;
  NullableValue<kj::OwnFd> local_28;
  undefined8 uStack_20;
  
  tryOpenSubdirInternal(&local_30,path);
  OVar1 = (Own<kj::ReadableDirectory,_std::nullptr_t>)
          Maybe<kj::OwnFd>::map<kj::Own<kj::ReadableDirectory,_std::nullptr_t>_(&)(kj::OwnFd)>
                    ((Maybe<kj::OwnFd> *)&local_28,
                     (_func_Own<kj::ReadableDirectory,_std::nullptr_t>_OwnFd *)&local_30);
  *(NullableValue<kj::OwnFd> *)this = local_28;
  *(undefined8 *)(this + 2) = uStack_20;
  uStack_20 = 0;
  if ((char)local_30.fd.fd == '\x01') {
    OwnFd::~OwnFd(&local_2c);
    OVar1.ptr = extraout_RDX;
    OVar1.disposer = extraout_RAX;
  }
  MVar2.ptr.disposer = OVar1.disposer;
  MVar2.ptr.ptr = OVar1.ptr;
  return (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>)MVar2.ptr;
}

Assistant:

Maybe<Own<const ReadableDirectory>> tryOpenSubdir(PathPtr path) const {
    return tryOpenSubdirInternal(path).map(newDiskReadableDirectory);
  }